

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_0::Register
               (MessageLite *containing_type,int number,ExtensionInfo info)

{
  hash_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>_>
  *collection;
  bool bVar1;
  LogMessage *pLVar2;
  pair<const_google::protobuf::MessageLite_*,_int> pVar3;
  LogFinisher local_a1;
  string local_a0;
  LogMessage local_70;
  MessageLite *local_38;
  int local_30;
  pair<const_google::protobuf::MessageLite_*,_int> local_28;
  int local_14;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *containing_type_local;
  
  local_14 = number;
  pMStack_10 = containing_type;
  GoogleOnceInit(&(anonymous_namespace)::registry_init_,InitRegistry);
  collection = (anonymous_namespace)::registry_;
  pVar3 = std::make_pair<google::protobuf::MessageLite_const*&,int&>
                    (&stack0xfffffffffffffff0,&local_14);
  local_38 = pVar3.first;
  local_30 = pVar3.second;
  local_28.first = local_38;
  local_28.second = local_30;
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::MessageLite_const*,int>,google::protobuf::internal::ExtensionInfo,google::protobuf::hash<std::pair<google::protobuf::MessageLite_const*,int>>,std::equal_to<std::pair<google::protobuf::MessageLite_const*,int>>>,std::pair<google::protobuf::MessageLite_const*,int>,google::protobuf::internal::ExtensionInfo>
                    (collection,&local_28,&info);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x55);
    pLVar2 = LogMessage::operator<<(&local_70,"Multiple extension registrations for type \"");
    (*pMStack_10->_vptr_MessageLite[2])(&local_a0);
    pLVar2 = LogMessage::operator<<(pLVar2,&local_a0);
    pLVar2 = LogMessage::operator<<(pLVar2,"\", field number ");
    pLVar2 = LogMessage::operator<<(pLVar2,local_14);
    pLVar2 = LogMessage::operator<<(pLVar2,".");
    LogFinisher::operator=(&local_a1,pLVar2);
    std::__cxx11::string::~string((string *)&local_a0);
    LogMessage::~LogMessage(&local_70);
  }
  return;
}

Assistant:

void Register(const MessageLite* containing_type,
              int number, ExtensionInfo info) {
  ::google::protobuf::GoogleOnceInit(&registry_init_, &InitRegistry);

  if (!InsertIfNotPresent(registry_, make_pair(containing_type, number),
                          info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << containing_type->GetTypeName()
               << "\", field number " << number << ".";
  }
}